

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool zip;
  bool validationCheck;
  bool hasIntensityUncertainty;
  int iVar1;
  size_t sVar2;
  int extraout_EDX;
  bool uncompressedSize;
  sigaction sa;
  char binFileName [4096];
  char idxFileName [4096];
  int local_2120;
  string local_2110;
  string local_20f0;
  _union_1457 local_20d0;
  sigset_t local_20c8;
  undefined4 local_2048;
  char acStack_203a [4096];
  char acStack_103a [4106];
  
  progname = *argv;
  memcpy(acStack_203a + 2,"footprint.bin",0x1000);
  memcpy(acStack_103a + 2,"footprint.idx",0x1000);
  local_2120 = -1;
  validationCheck = true;
  zip = false;
  uncompressedSize = false;
  hasIntensityUncertainty = true;
  do {
    while( true ) {
      while (iVar1 = getopt(argc,argv,"i:nb:x:zuNhv"), 0x68 < iVar1) {
        switch(iVar1) {
        case 0x75:
          uncompressedSize = true;
          break;
        case 0x76:
          goto switchD_001038fa_caseD_76;
        case 0x77:
        case 0x79:
          goto switchD_001038fa_caseD_77;
        case 0x78:
          strcpy(acStack_103a + 2,_optarg);
          break;
        case 0x7a:
          zip = true;
          break;
        default:
          if (iVar1 == 0x6e) {
            hasIntensityUncertainty = false;
          }
          else {
            if (iVar1 != 0x69) goto switchD_001038fa_caseD_77;
            local_2120 = atoi(_optarg);
          }
        }
      }
      if (iVar1 != 0x62) break;
      strcpy(acStack_203a + 2,_optarg);
    }
    if (iVar1 == -1) {
      if (local_2120 != -1) {
        if (uncompressedSize == true && zip == false) {
          main_cold_2();
          uncompressedSize = false;
        }
        if (zip == false) goto LAB_00103a5f;
        sVar2 = strlen(acStack_203a + 2);
        if (sVar2 < 2) {
LAB_001039e3:
          sVar2 = strlen(acStack_203a + 2);
          (acStack_203a + sVar2 + 2)[0] = '.';
          (acStack_203a + sVar2 + 2)[1] = 'z';
          acStack_203a[sVar2 + 4] = '\0';
        }
        else {
          strcpy((char *)&local_20d0,acStack_203a + sVar2);
          if (local_20d0._2_1_ != '\0' || local_20d0._0_2_ != 0x7a2e) goto LAB_001039e3;
        }
        sVar2 = strlen(acStack_103a + 2);
        if (1 < sVar2) {
          strcpy((char *)&local_20d0,acStack_103a + sVar2);
          if (local_20d0._2_1_ == '\0' && local_20d0._0_2_ == 0x7a2e) goto LAB_00103a5f;
        }
        sVar2 = strlen(acStack_103a + 2);
        (acStack_103a + sVar2 + 2)[0] = '.';
        (acStack_103a + sVar2 + 2)[1] = 'z';
        acStack_103a[sVar2 + 4] = '\0';
LAB_00103a5f:
        memset(&local_20d0,0,0x98);
        sigemptyset(&local_20c8);
        local_20d0.sa_handler = SegFaultSigAction;
        local_2048 = 4;
        sigaction(0xb,(sigaction *)&local_20d0,(sigaction *)0x0);
        local_20f0._M_dataplus._M_p = (pointer)&local_20f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_20f0,"");
        local_2110._M_dataplus._M_p = (pointer)&local_2110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2110,"");
        initstreams(&local_20f0,&local_2110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2110._M_dataplus._M_p != &local_2110.field_2) {
          operator_delete(local_2110._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_20f0._M_dataplus._M_p != &local_20f0.field_2) {
          operator_delete(local_20f0._M_dataplus._M_p);
        }
        DoIt(local_2120,hasIntensityUncertainty,acStack_203a + 2,acStack_103a + 2,uncompressedSize,
             zip,validationCheck);
        return 0;
      }
      goto LAB_00103b75;
    }
    if (iVar1 != 0x4e) {
switchD_001038fa_caseD_77:
      main_cold_5();
switchD_001038fa_caseD_76:
      main_cold_1();
LAB_00103b75:
      main_cold_4();
      if (extraout_EDX == 1) {
        main_cold_3();
      }
      _Unwind_Resume();
    }
    validationCheck = false;
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {

  progname = argv[0];
  int maxIntensityBinIdx = -1;
  bool hasIntensityUncertainty = true;
  char binFileName[4096] = "footprint.bin";
  char idxFileName[4096] = "footprint.idx";
  bool zip = false;
  bool uncompressedSize = false;
  bool validationCheck = true;
  int opt;
  while ((opt = getopt(argc, argv, "i:nb:x:zuNhv")) != -1) {
    switch (opt) {
      case 'i':
        maxIntensityBinIdx = atoi(optarg);
	break;
      case 'n':
	hasIntensityUncertainty = false;
	break;
      case 'b':
	strcpy(binFileName, optarg);
	break;
      case 'x':
	strcpy(idxFileName, optarg);
	break;
      case 'z':
	zip = true;
	break;
      case 'u':
	uncompressedSize = true;
	break;
      case 'N':
	validationCheck = false;
	break;
      case 'v':
#ifdef AREAPERIL_TYPE_UNSIGNED_LONG_LONG
        fprintf(stderr, "%s : version : %s :"
			" Areaperil ID data type unsigned long long\n",
		argv[0], VERSION);
#else
	fprintf(stderr, "%s : version : %s\n", argv[0], VERSION);
#endif
        exit(EXIT_FAILURE);
      case 'h':
      default:
	Help();
	exit(EXIT_FAILURE);
    }
  }

  if (maxIntensityBinIdx == -1) {
    fprintf(stderr, "ERROR: Intensity bin parameter not supplied.\n");
    exit(EXIT_FAILURE);
  }

  if (uncompressedSize && !zip) {
    fprintf(stderr, "WARNING: Zip footprint data argument not supplied."
		    " Ignoring request to include uncompressed data size in"
		    " index file.\n");
    uncompressedSize = false;
  }

  // Ensure zip file names have .z suffix
  if (zip) {
    char endChars[3];

    if (strlen(binFileName) < 2) {
      strcat(binFileName, ".z");
    } else {
      strcpy(endChars, binFileName + (strlen(binFileName) - 2));
      if (strcmp(endChars, ".z")) strcat(binFileName, ".z");
    }

    if (strlen(idxFileName) < 2) {
      strcat(idxFileName, ".z");
    } else {
      strcpy(endChars, idxFileName + (strlen(idxFileName) - 2));
      if (strcmp(endChars, ".z")) strcat(idxFileName, ".z");
    }
  }

#if !defined(_MSC_VER) && !defined(__MINGW32__)
  struct sigaction sa;

  memset(&sa, 0, sizeof(struct sigaction));
  sigemptyset(&sa.sa_mask);
  sa.sa_sigaction = SegFaultSigAction;
  sa.sa_flags = SA_SIGINFO;

  sigaction(SIGSEGV, &sa, NULL);
#endif

  try {

    initstreams();
    DoIt(maxIntensityBinIdx, hasIntensityUncertainty, binFileName, idxFileName,
	 uncompressedSize, zip, validationCheck);
    return 0;

  } catch (std::bad_alloc&) {

    fprintf(stderr, "ERROR: %s: Memory allocation failed.\n", progname);
    exit(EXIT_FAILURE);

  }

}